

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isonumber.c
# Opt level: O0

int isonumber_to_s64(int64_t *dst,char *iso,uint64_t scaling)

{
  int iVar1;
  uint64_t local_38;
  uint64_t u64;
  char *pcStack_28;
  int result;
  char *ptr;
  uint64_t scaling_local;
  char *iso_local;
  int64_t *dst_local;
  
  pcStack_28 = iso;
  if (*iso == '-') {
    pcStack_28 = iso + 1;
  }
  ptr = (char *)scaling;
  scaling_local = (uint64_t)iso;
  iso_local = (char *)dst;
  iVar1 = isonumber_to_u64(&local_38,pcStack_28,scaling);
  if (iVar1 == 0) {
    if (*(char *)scaling_local == '-') {
      *(uint64_t *)iso_local = -local_38;
    }
    else {
      *(uint64_t *)iso_local = local_38;
    }
  }
  return iVar1;
}

Assistant:

int
isonumber_to_s64(int64_t *dst, const char *iso, uint64_t scaling) {
  const char *ptr;
  int result;
  uint64_t u64;

  ptr = iso;
  if (*iso == '-') {
    ptr++;
  }

  result = isonumber_to_u64(&u64, ptr, scaling);
  if (!result) {
    if (*iso == '-') {
      *dst = -((int64_t)u64);
    }
    else {
      *dst = (int64_t)u64;
    }
  }
  return result;
}